

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# buflist.c
# Opt level: O3

size_t lws_buflist_total_len(lws_buflist **head)

{
  size_t sVar1;
  lws_buflist *plVar2;
  
  sVar1 = 0;
  for (plVar2 = *head; plVar2 != (lws_buflist *)0x0; plVar2 = plVar2->next) {
    sVar1 = sVar1 + plVar2->len;
  }
  return sVar1;
}

Assistant:

size_t
lws_buflist_total_len(struct lws_buflist **head)
{
	struct lws_buflist *p = *head;
	size_t size = 0;

	while (p) {
		size += p->len;
		p = p->next;
	}

	return size;
}